

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMCount.hpp
# Opt level: O0

ostream * operator<<(ostream *target,StrX *toDump)

{
  char *pcVar1;
  StrX *toDump_local;
  ostream *target_local;
  
  pcVar1 = StrX::localForm(toDump);
  std::operator<<(target,pcVar1);
  return target;
}

Assistant:

inline std::ostream& operator<<(std::ostream& target, const StrX& toDump)
{
    target << toDump.localForm();
    return target;
}